

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

void __thiscall diy::Bounds<int>::Bounds(Bounds<int> *this,int dim)

{
  allocator<int> local_22;
  allocator<int> local_21;
  int local_20 [2];
  
  local_20[0] = 0;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)this,(long)dim,local_20,&local_22)
  ;
  local_20[1] = 0;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,(long)dim,
             local_20 + 1,&local_21);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}